

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

uint __thiscall Js::StepController::GetScriptId(StepController *this,FunctionBody *body)

{
  code *pcVar1;
  bool bVar2;
  Utf8SourceInfo *pUVar3;
  undefined4 *puVar4;
  uint local_1c;
  uint retValue;
  FunctionBody *body_local;
  StepController *this_local;
  
  local_1c = 0;
  if (body != (FunctionBody *)0x0) {
    pUVar3 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
    if (pUVar3 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0x156,"(body->GetUtf8SourceInfo() != nullptr)",
                                  "body->GetUtf8SourceInfo() == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pUVar3 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
    local_1c = Utf8SourceInfo::GetSourceInfoId(pUVar3);
  }
  return local_1c;
}

Assistant:

uint StepController::GetScriptId(_In_ FunctionBody* body)
    {
        // safe value
        uint retValue = BuiltInFunctionsScriptId;

        if (body != nullptr)
        {
            // FYI - Different script blocks within a HTML page will have different source Info ids even though they have the same backing file.
            // It might imply we notify the debugger a bit more than needed - thus can be TODO for performance improvements of the Just-My-Code
            // or step to next document boundary mode.
            AssertMsg(body->GetUtf8SourceInfo() != nullptr, "body->GetUtf8SourceInfo() == nullptr");
            retValue = body->GetUtf8SourceInfo()->GetSourceInfoId();
        }

        return retValue;
    }